

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_1c2de7::setInputDeepFrameBuffer
               (DeepFrameBuffer *frameBuffer,int pixelType,Array2D<unsigned_int_*> *uData,
               Array2D<float_*> *fData,Array2D<half_*> *hData,int width,int height)

{
  ulong uVar1;
  uint **b;
  float **b_00;
  half **b_01;
  char *name;
  long lVar2;
  DeepSlice DStack_68;
  
  if (pixelType == 2) {
    lVar2 = (long)width;
    uVar1 = height * lVar2;
    b_01 = (half **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    if (hData->_data != (half **)0x0) {
      operator_delete__(hData->_data);
    }
    hData->_sizeX = (long)height;
    hData->_sizeY = lVar2;
    hData->_data = b_01;
    Imf_2_5::DeepSlice::DeepSlice(&DStack_68,HALF,(char *)b_01,8,lVar2 << 3,2,1,1,0.0,false,false);
    name = "HALF";
  }
  else if (pixelType == 1) {
    lVar2 = (long)width;
    uVar1 = height * lVar2;
    b_00 = (float **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    if (fData->_data != (float **)0x0) {
      operator_delete__(fData->_data);
    }
    fData->_sizeX = (long)height;
    fData->_sizeY = lVar2;
    fData->_data = b_00;
    Imf_2_5::DeepSlice::DeepSlice(&DStack_68,FLOAT,(char *)b_00,8,lVar2 << 3,4,1,1,0.0,false,false);
    name = "FLOAT";
  }
  else {
    if (pixelType != 0) {
      return;
    }
    lVar2 = (long)width;
    uVar1 = height * lVar2;
    b = (uint **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    if (uData->_data != (uint **)0x0) {
      operator_delete__(uData->_data);
    }
    uData->_sizeX = (long)height;
    uData->_sizeY = lVar2;
    uData->_data = b;
    Imf_2_5::DeepSlice::DeepSlice(&DStack_68,UINT,(char *)b,8,lVar2 << 3,4,1,1,0.0,false,false);
    name = "UINT";
  }
  Imf_2_5::DeepFrameBuffer::insert(frameBuffer,name,&DStack_68);
  return;
}

Assistant:

void setInputDeepFrameBuffer(DeepFrameBuffer& frameBuffer, int pixelType,
                             Array2D<unsigned int*>& uData, Array2D<float*>& fData,
                             Array2D<half*>& hData, int width, int height)
{
    switch (pixelType)
    {
        case 0:
            uData.resizeErase(height, width);
            frameBuffer.insert ("UINT",
                                DeepSlice (IMF::UINT,
                                (char *) (&uData[0][0]),
                                sizeof (uData[0][0]) * 1,
                                sizeof (uData[0][0]) * width,
                                sizeof (unsigned int)));
            break;
        case 1:
            fData.resizeErase(height, width);
            frameBuffer.insert ("FLOAT",
                                DeepSlice (IMF::FLOAT,
                                (char *) (&fData[0][0]),
                                sizeof (fData[0][0]) * 1,
                                sizeof (fData[0][0]) * width,
                                sizeof (float)));
            break;
        case 2:
            hData.resizeErase(height, width);
            frameBuffer.insert ("HALF",
                                DeepSlice (IMF::HALF,
                                (char *) (&hData[0][0]),
                                sizeof (hData[0][0]) * 1,
                                sizeof (hData[0][0]) * width,
                                sizeof (half)));
            break;
    }
}